

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void unixepochFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  undefined1 local_50 [8];
  DateTime x;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  x._40_8_ = argv;
  iVar1 = isDate(context,argc,argv,(DateTime *)local_50);
  if (iVar1 == 0) {
    computeJD((DateTime *)local_50);
    if (x.s._7_1_ == '\0') {
      sqlite3_result_int64(context,(long)local_50 / 1000 + -0x3118a36940);
    }
    else {
      sqlite3_result_double(context,(double)((long)local_50 + -0xbfc83e532200) / 1000.0);
    }
  }
  return;
}

Assistant:

static void unixepochFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    computeJD(&x);
    if( x.useSubsec ){
      sqlite3_result_double(context, (x.iJD - 21086676*(i64)10000000)/1000.0);
    }else{
      sqlite3_result_int64(context, x.iJD/1000 - 21086676*(i64)10000);
    }
  }
}